

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_cab.c
# Opt level: O0

void lzx_translation(lzx_stream *strm,void *p,size_t size,uint32_t offset)

{
  uint32_t uVar1;
  lzx_dec *plVar2;
  int iVar3;
  uchar *puVar4;
  bool bVar5;
  uint32_t local_50;
  int32_t value;
  int32_t displacement;
  int32_t cp;
  size_t i;
  uchar *end;
  uchar *b;
  lzx_dec *ds;
  uint32_t offset_local;
  size_t size_local;
  void *p_local;
  lzx_stream *strm_local;
  
  plVar2 = strm->ds;
  if ((plVar2->translation != '\0') && (10 < size)) {
    puVar4 = (uchar *)((long)p + (size - 10));
    end = (uchar *)p;
    while( true ) {
      bVar5 = false;
      if (end < puVar4) {
        end = (uchar *)memchr(end,0xe8,(long)puVar4 - (long)end);
        bVar5 = end != (uchar *)0x0;
      }
      if (!bVar5) break;
      iVar3 = offset + ((int)end - (int)p);
      local_50 = archive_le32dec(end + 1);
      if ((SBORROW4(local_50,-iVar3) == (int)(local_50 + iVar3) < 0) &&
         ((int)local_50 < (int)plVar2->translation_size)) {
        if ((int)local_50 < 0) {
          uVar1 = plVar2->translation_size;
        }
        else {
          uVar1 = -iVar3;
        }
        local_50 = local_50 + uVar1;
        archive_le32enc(end + 1,local_50);
      }
      end = end + 5;
    }
  }
  return;
}

Assistant:

static void
lzx_translation(struct lzx_stream *strm, void *p, size_t size, uint32_t offset)
{
	struct lzx_dec *ds = strm->ds;
	unsigned char *b, *end;

	if (!ds->translation || size <= 10)
		return;
	b = p;
	end = b + size - 10;
	while (b < end && (b = memchr(b, 0xE8, end - b)) != NULL) {
		size_t i = b - (unsigned char *)p;
		int32_t cp, displacement, value;

		cp = (int32_t)(offset + (uint32_t)i);
		value = archive_le32dec(&b[1]);
		if (value >= -cp && value < (int32_t)ds->translation_size) {
			if (value >= 0)
				displacement = value - cp;
			else
				displacement = value + ds->translation_size;
			archive_le32enc(&b[1], (uint32_t)displacement);
		}
		b += 5;
	}
}